

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O2

Gia_Man_t * Gia_ManOrigIdsReduce(Gia_Man_t *p,Vec_Int_t *vPairs)

{
  uint uVar1;
  int iVar2;
  int iLit1;
  Vec_Int_t *p_00;
  Gia_Man_t *p_01;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  Gia_Rpr_t *pGVar6;
  long lVar7;
  int *piVar8;
  uint Num;
  int iVar9;
  
  p_00 = Gia_ManOrigIdsRemapPairs(vPairs,p->nObjs);
  Gia_ManSetPhase(p);
  p_01 = Gia_ManStart(p->nObjs);
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_01->pSpec = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_01->pName = pcVar3;
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  iVar9 = 0;
  while ((iVar9 < p->vCis->nSize && (pGVar4 = Gia_ManCi(p,iVar9), pGVar4 != (Gia_Obj_t *)0x0))) {
    uVar1 = Gia_ManAppendCi(p_01);
    pGVar4->Value = uVar1;
    iVar9 = iVar9 + 1;
  }
  Gia_ManHashAlloc(p_01);
  iVar9 = 0;
  while ((iVar9 < p->nObjs && (pGVar4 = Gia_ManObj(p,iVar9), pGVar4 != (Gia_Obj_t *)0x0))) {
    if ((~*(uint *)pGVar4 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar4) {
      iVar2 = Vec_IntEntry(p_00,iVar9);
      if (iVar2 == -1) {
        iVar2 = Gia_ObjFanin0Copy(pGVar4);
        iLit1 = Gia_ObjFanin1Copy(pGVar4);
        uVar1 = Gia_ManHashAnd(p_01,iVar2,iLit1);
      }
      else {
        iVar2 = Vec_IntEntry(p_00,iVar9);
        pGVar5 = Gia_ManObj(p,iVar2);
        uVar1 = Abc_LitNotCond(pGVar5->Value,
                               ((uint)((ulong)*(undefined8 *)pGVar4 >> 0x20) ^
                               (uint)((ulong)*(undefined8 *)pGVar5 >> 0x20)) >> 0x1f);
      }
      pGVar4->Value = uVar1;
    }
    iVar9 = iVar9 + 1;
  }
  Gia_ManHashStop(p_01);
  iVar9 = 0;
  while ((iVar9 < p->vCos->nSize && (pGVar4 = Gia_ManCo(p,iVar9), pGVar4 != (Gia_Obj_t *)0x0))) {
    iVar2 = Gia_ObjFanin0Copy(pGVar4);
    uVar1 = Gia_ManAppendCo(p_01,iVar2);
    pGVar4->Value = uVar1;
    iVar9 = iVar9 + 1;
  }
  Vec_IntFree(p_00);
  if ((p->pReprs != (Gia_Rpr_t *)0x0) || (p->pNexts != (int *)0x0)) {
    __assert_fail("!p->pReprs && !p->pNexts",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                  ,0x87,"Gia_Man_t *Gia_ManOrigIdsReduce(Gia_Man_t *, Vec_Int_t *)");
  }
  iVar9 = p->nObjs;
  pGVar6 = (Gia_Rpr_t *)calloc((long)iVar9,4);
  p->pReprs = pGVar6;
  for (lVar7 = 0; lVar7 < iVar9; lVar7 = lVar7 + 1) {
    p->pReprs[lVar7] = (Gia_Rpr_t)((uint)p->pReprs[lVar7] | 0xfffffff);
    iVar9 = p->nObjs;
  }
  Gia_ManFillValue(p_01);
  uVar1 = 0;
  do {
    if ((p->nObjs <= (int)uVar1) || (pGVar4 = Gia_ManObj(p,uVar1), pGVar4 == (Gia_Obj_t *)0x0)) {
      piVar8 = Gia_ManDeriveNexts(p);
      p->pNexts = piVar8;
      return p_01;
    }
    if ((~*(uint *)pGVar4 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar4) {
      iVar9 = Abc_Lit2Var(pGVar4->Value);
      if (iVar9 == 0) {
        Num = 0;
      }
      else {
        pGVar4 = Gia_ManObj(p_01,iVar9);
        Num = pGVar4->Value;
        if (Num == 0xffffffff) {
          pGVar4->Value = uVar1;
          goto LAB_001e44b5;
        }
      }
      Gia_ObjSetRepr(p,uVar1,Num);
    }
LAB_001e44b5:
    uVar1 = uVar1 + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManOrigIdsReduce( Gia_Man_t * p, Vec_Int_t * vPairs )
{
    Gia_Man_t * pNew = NULL;
    Gia_Obj_t * pObj, * pRepr; int i;
    Vec_Int_t * vMap = Gia_ManOrigIdsRemapPairs( vPairs, Gia_ManObjNum(p) );
    Gia_ManSetPhase( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManFillValue(p);
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( Vec_IntEntry(vMap, i) == -1 )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else
        {
            pRepr = Gia_ManObj( p, Vec_IntEntry(vMap, i) );
            pObj->Value = Abc_LitNotCond( pRepr->Value, pRepr->fPhase ^ pObj->fPhase );
        }
    }
    Gia_ManHashStop( pNew );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Vec_IntFree( vMap );
    // compute equivalences
    assert( !p->pReprs && !p->pNexts );
    p->pReprs = ABC_CALLOC( Gia_Rpr_t, Gia_ManObjNum(p) );
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
        Gia_ObjSetRepr( p, i, GIA_VOID );
    Gia_ManFillValue(pNew);
    Gia_ManForEachAnd( p, pObj, i )
    {
        int iRepr = Abc_Lit2Var(pObj->Value);
        if ( iRepr == 0 )
        {
            Gia_ObjSetRepr( p, i, 0 );
            continue;
        }
        pRepr = Gia_ManObj( pNew, iRepr );
        if ( !~pRepr->Value ) // first time
        {
            pRepr->Value = i;
            continue;
        }
        // add equivalence
        Gia_ObjSetRepr( p, i, pRepr->Value );
    }
    p->pNexts = Gia_ManDeriveNexts( p );
    return pNew;
}